

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Label.cpp
# Opt level: O1

int __thiscall tiles::Label::init(Label *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  long *in_RCX;
  uint in_EDX;
  pointer *__ptr;
  _Head_base<0UL,_Entity_*,_false> _Var2;
  _Head_base<0UL,_Entity_*,_false> local_38;
  uint local_2c;
  Entity *local_28;
  
  local_2c = in_EDX;
  Chunk::markTileDirty((Chunk *)ctx,in_EDX);
  *(uint *)(ctx + (ulong)in_EDX * 4) = *(uint *)(ctx + (ulong)in_EDX * 4) & 0xffffc0e0 | 0x12;
  if (in_RCX == (long *)0x0) {
    details::make_unique<entities::Label,_Chunk_&,_unsigned_int_&,_0>
              ((details *)&local_28,(Chunk *)ctx,&local_2c);
    local_38._M_head_impl = local_28;
    local_28 = (Entity *)0x0;
    Chunk::allocateEntity
              ((Chunk *)ctx,local_2c,(unique_ptr<Entity,_std::default_delete<Entity>_> *)&local_38);
    iVar1 = extraout_EAX_00;
    if (local_38._M_head_impl != (Entity *)0x0) {
      iVar1 = (*(local_38._M_head_impl)->_vptr_Entity[1])();
    }
    local_38._M_head_impl = (Entity *)0x0;
    _Var2._M_head_impl = local_28;
  }
  else {
    (**(code **)(*in_RCX + 0x18))(&local_38);
    Chunk::allocateEntity
              ((Chunk *)ctx,local_2c,(unique_ptr<Entity,_std::default_delete<Entity>_> *)&local_38);
    _Var2._M_head_impl = local_38._M_head_impl;
    iVar1 = extraout_EAX;
  }
  if (_Var2._M_head_impl != (Entity *)0x0) {
    iVar1 = (*(_Var2._M_head_impl)->_vptr_Entity[1])();
  }
  return iVar1;
}

Assistant:

void Label::init(Chunk& chunk, unsigned int tileIndex, const entities::Label* labelToCopy) {
    auto& tileData = modifyTileData(chunk, tileIndex);
    tileData.id = TileId::label;
    tileData.state1 = State::disconnected;
    tileData.state2 = State::disconnected;
    tileData.dir = Direction::north;
    if (labelToCopy == nullptr) {
        allocateEntity(chunk, tileIndex, details::make_unique<entities::Label>(chunk, tileIndex));
    } else {
        allocateEntity(chunk, tileIndex, labelToCopy->clone(chunk, tileIndex));
    }
}